

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int star_oh(char *z)

{
  int iVar1;
  bool local_11;
  char *z_local;
  
  iVar1 = isConsonant(z);
  local_11 = false;
  if ((((iVar1 != 0) && (local_11 = false, *z != 'w')) && (local_11 = false, *z != 'x')) &&
     (local_11 = false, *z != 'y')) {
    iVar1 = isVowel(z + 1);
    local_11 = false;
    if (iVar1 != 0) {
      iVar1 = isConsonant(z + 2);
      local_11 = iVar1 != 0;
    }
  }
  return (int)local_11;
}

Assistant:

static int star_oh(const char *z){
  return
    isConsonant(z) &&
    z[0]!='w' && z[0]!='x' && z[0]!='y' &&
    isVowel(z+1) &&
    isConsonant(z+2);
}